

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  int iVar1;
  ImDrawList *this;
  ImVec2 pos_00;
  ImVec2 IVar2;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID IVar6;
  ImU32 IVar7;
  ImGuiWindow *pIVar8;
  ImGuiContext *g;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool hovered;
  float local_f4;
  bool held;
  ImGuiID local_ec;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  float local_88;
  float fStack_84;
  ImVec2 local_70;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  
  pIVar3 = GImGui;
  iVar1 = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar8 = pIVar3->CurrentWindow;
  pIVar8->WriteAccessed = true;
  if (pIVar8->SkipItems != false) {
    return false;
  }
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                  ,0x547,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  IVar6 = ImGuiWindow::GetID(pIVar8,label,(char *)0x0);
  local_f4 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_f4 = GetFrameHeight();
  }
  IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar10 = GetNextItemWidth();
  fVar11 = local_f4;
  if ((flags & 0x40U) == 0) {
    fVar11 = fVar10;
  }
  local_88 = IVar2.x;
  fStack_84 = IVar2.y;
  fVar10 = (pIVar3->Style).FramePadding.y;
  frame_bb.Min.x = (pIVar8->DC).CursorPos.x;
  frame_bb.Min.y = (pIVar8->DC).CursorPos.y;
  frame_bb.Max.x = fVar11 + frame_bb.Min.x;
  frame_bb.Max.y = fVar10 + fVar10 + fStack_84 + frame_bb.Min.y;
  fVar12 = 0.0;
  if (0.0 < local_88) {
    fVar12 = (pIVar3->Style).ItemInnerSpacing.x + local_88;
  }
  total_bb.Max.x = fVar12 + frame_bb.Max.x;
  total_bb.Max.y = frame_bb.Max.y + 0.0;
  local_ec = IVar6;
  total_bb.Min.x = frame_bb.Min.x;
  total_bb.Min.y = frame_bb.Min.y;
  ItemSize(&total_bb,fVar10);
  IVar6 = local_ec;
  bVar4 = ItemAdd(&total_bb,local_ec,&frame_bb);
  if (!bVar4) {
    return false;
  }
  bVar4 = ButtonBehavior(&frame_bb,IVar6,&hovered,&held,0);
  bVar5 = IsPopupOpen(IVar6);
  IVar7 = GetColorU32(hovered + 7,1.0);
  fVar12 = frame_bb.Max.x;
  fVar10 = frame_bb.Min.x;
  RenderNavHighlight(&frame_bb,IVar6,1);
  uVar9 = -(uint)(fVar12 - local_f4 <= fVar10);
  fVar10 = (float)(uVar9 & (uint)fVar10 | ~uVar9 & (uint)(fVar12 - local_f4));
  if ((flags & 0x40U) == 0) {
    name._4_4_ = frame_bb.Max.y;
    name._0_4_ = fVar10;
    ImDrawList::AddRectFilled
              (pIVar8->DrawList,&frame_bb.Min,(ImVec2 *)name,IVar7,(pIVar3->Style).FrameRounding,5);
  }
  if ((flags & 0x20U) == 0) {
    this = pIVar8->DrawList;
    name._4_4_ = frame_bb.Min.y;
    name._0_4_ = fVar10;
    IVar7 = GetColorU32(((byte)(hovered | bVar5) & 1) + 0x15,1.0);
    ImDrawList::AddRectFilled
              (this,(ImVec2 *)name,&frame_bb.Max,IVar7,(pIVar3->Style).FrameRounding,
               (uint)(fVar11 <= local_f4) * 5 + 10);
    fVar12 = (pIVar3->Style).FramePadding.y;
    IVar2.y = fVar12 + frame_bb.Min.y;
    IVar2.x = fVar12 + fVar10;
    RenderArrow(IVar2,3,1.0);
  }
  p_min.y = frame_bb.Min.y;
  p_min.x = frame_bb.Min.x;
  p_max.y = frame_bb.Max.y;
  p_max.x = frame_bb.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar3->Style).FrameRounding);
  if (preview_value != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar2 = (pIVar3->Style).FramePadding;
    name._0_4_ = IVar2.x + frame_bb.Min.x;
    name._4_4_ = IVar2.y + frame_bb.Min.y;
    r_outer.Min.y = frame_bb.Max.y;
    r_outer.Min.x = fVar10;
    size_expected.x = 0.0;
    size_expected.y = 0.0;
    RenderTextClipped((ImVec2 *)name,&r_outer.Min,preview_value,(char *)0x0,(ImVec2 *)0x0,
                      &size_expected,(ImRect *)0x0);
  }
  IVar6 = local_ec;
  if (0.0 < local_88) {
    pos_00.y = (pIVar3->Style).FramePadding.y + frame_bb.Min.y;
    pos_00.x = (pIVar3->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    RenderText(pos_00,label,(char *)0x0,true);
  }
  if (bVar4) {
    if (bVar5) goto LAB_0012eae9;
  }
  else if (pIVar3->NavActivateId != IVar6 || bVar5) {
    if (!bVar5) {
      return false;
    }
    goto LAB_0012eae9;
  }
  if ((pIVar8->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
    pIVar8->NavLastIds[0] = IVar6;
  }
  OpenPopupEx(IVar6);
LAB_0012eae9:
  if (iVar1 == 0) {
    uVar9 = flags | 4;
    if ((flags & 0x1eU) != 0) {
      uVar9 = flags;
    }
    flags = uVar9;
    uVar9 = (flags & 0x1eU) - 1;
    if ((flags & 0x1eU ^ uVar9) <= uVar9) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                    ,0x57e,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    if ((flags & 4U) == 0) {
      if ((flags & 2U) == 0) {
        uVar9 = -(uint)((flags & 8U) == 0) | 0x14;
      }
      else {
        uVar9 = 4;
      }
    }
    else {
      uVar9 = 8;
    }
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name._0_4_ = fVar11;
    fVar11 = CalcMaxPopupHeightFromItemCount(uVar9);
    r_outer.Min.y = fVar11;
    r_outer.Min.x = 3.4028235e+38;
    SetNextWindowSizeConstraints((ImVec2 *)name,&r_outer.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  else {
    (pIVar3->NextWindowData).SizeConstraintCond = iVar1;
    fVar10 = (pIVar3->NextWindowData).SizeConstraintRect.Min.x;
    uVar9 = -(uint)(fVar11 <= fVar10);
    (pIVar3->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar9 & (uint)fVar11 | (uint)fVar10 & uVar9);
  }
  ImFormatString(name,0x10,"##Combo_%02d",(ulong)(uint)(pIVar3->BeginPopupStack).Size);
  pIVar8 = FindWindowByName(name);
  if ((pIVar8 != (ImGuiWindow *)0x0) && (pIVar8->WasActive == true)) {
    size_expected = CalcWindowExpectedSize(pIVar8);
    if ((flags & 1U) != 0) {
      pIVar8->AutoPosLastDirection = 0;
    }
    r_outer = GetWindowAllowedExtentRect(pIVar8);
    local_70.y = frame_bb.Max.y;
    local_70.x = frame_bb.Min.x;
    pos = FindBestWindowPosForPopupEx
                    (&local_70,&size_expected,&pIVar8->AutoPosLastDirection,&r_outer,&frame_bb,
                     ImGuiPopupPositionPolicy_ComboBox);
    local_70.x = 0.0;
    local_70.y = 0.0;
    SetNextWindowPos(&pos,0,&local_70);
  }
  r_outer.Min.y = (pIVar3->Style).WindowPadding.y;
  r_outer.Min.x = (pIVar3->Style).FramePadding.x;
  PushStyleVar(1,&r_outer.Min);
  bVar4 = Begin(name,(bool *)0x0,0x4000143);
  PopStyleVar(1);
  if (!bVar4) {
    EndPopup();
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                  ,0x59d,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  return true;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = GetNextItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}